

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_fighterhammer.cpp
# Opt level: O0

int AF_A_FHammerThrow(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  DObject *this;
  DObject *this_00;
  long *plVar1;
  AWeapon *this_01;
  PClassActor *type;
  AActor *pAVar2;
  bool bVar3;
  bool local_6e;
  bool local_6b;
  AWeapon *weapon;
  player_t *player;
  AActor *mo;
  FStateParamInfo *stateinfo;
  AActor *stateowner;
  AActor *self;
  int paramnum;
  int numret_local;
  VMReturn *ret_local;
  int numparam_local;
  VMValue *param_local;
  VMFrameStack *stack_local;
  
  if (numparam < 1) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_hexen/a_fighterhammer.cpp"
                  ,0x62,"int AF_A_FHammerThrow(VMFrameStack *, VMValue *, int, VMReturn *, int)");
  }
  bVar3 = false;
  if (((param->field_0).field_3.Type == '\x03') &&
     (bVar3 = true, (param->field_0).field_1.atag != 1)) {
    bVar3 = (param->field_0).field_1.a == (void *)0x0;
  }
  if (!bVar3) {
    __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_hexen/a_fighterhammer.cpp"
                  ,0x62,"int AF_A_FHammerThrow(VMFrameStack *, VMValue *, int, VMReturn *, int)");
  }
  this = (DObject *)(param->field_0).field_1.a;
  local_6b = true;
  if (this != (DObject *)0x0) {
    local_6b = DObject::IsKindOf(this,AActor::RegistrationInfo.MyClass);
  }
  if (local_6b == false) {
    __assert_fail("self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))",
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_hexen/a_fighterhammer.cpp"
                  ,0x62,"int AF_A_FHammerThrow(VMFrameStack *, VMValue *, int, VMReturn *, int)");
  }
  if ((1 < numparam) && (param[1].field_0.field_3.Type != 0xff)) {
    bVar3 = false;
    if ((param[1].field_0.field_3.Type == '\x03') &&
       (bVar3 = true, param[1].field_0.field_1.atag != 1)) {
      bVar3 = param[1].field_0.field_1.a == (void *)0x0;
    }
    if (!bVar3) {
      __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_hexen/a_fighterhammer.cpp"
                    ,0x62,"int AF_A_FHammerThrow(VMFrameStack *, VMValue *, int, VMReturn *, int)");
    }
    this_00 = (DObject *)param[1].field_0.field_1.a;
    local_6e = true;
    if (this_00 != (DObject *)0x0) {
      local_6e = DObject::IsKindOf(this_00,AActor::RegistrationInfo.MyClass);
    }
    if (local_6e == false) {
      __assert_fail("stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))",
                    "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_hexen/a_fighterhammer.cpp"
                    ,0x62,"int AF_A_FHammerThrow(VMFrameStack *, VMValue *, int, VMReturn *, int)");
    }
  }
  if ((2 < numparam) && (param[2].field_0.field_3.Type != 0xff)) {
    bVar3 = false;
    if ((param[2].field_0.field_3.Type == '\x03') &&
       (bVar3 = true, param[2].field_0.field_1.atag != 8)) {
      bVar3 = param[2].field_0.field_1.a == (void *)0x0;
    }
    if (!bVar3) {
      __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_hexen/a_fighterhammer.cpp"
                    ,0x62,"int AF_A_FHammerThrow(VMFrameStack *, VMValue *, int, VMReturn *, int)");
    }
  }
  plVar1 = *(long **)&this[0xc].ObjectFlags;
  if (((plVar1 != (long *)0x0) && (*(int *)(*plVar1 + 0x1c8) != 0)) &&
     ((this_01 = (AWeapon *)plVar1[0x1a], this_01 == (AWeapon *)0x0 ||
      (bVar3 = AWeapon::DepleteAmmo(this_01,(bool)(this_01->bAltFire & 1),false,-1), bVar3)))) {
    pAVar2 = (AActor *)*plVar1;
    type = PClass::FindActor("HammerMissile");
    pAVar2 = P_SpawnPlayerMissile(pAVar2,type);
    if (pAVar2 != (AActor *)0x0) {
      pAVar2->special1 = 0;
    }
  }
  return 0;
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_FHammerThrow)
{
	PARAM_ACTION_PROLOGUE;

	AActor *mo;
	player_t *player;

	if (NULL == (player = self->player))
	{
		return 0;
	}

	if (!player->mo->weaponspecial)
	{
		return 0;
	}
	AWeapon *weapon = player->ReadyWeapon;
	if (weapon != NULL)
	{
		if (!weapon->DepleteAmmo (weapon->bAltFire, false))
			return 0;
	}
	mo = P_SpawnPlayerMissile (player->mo, PClass::FindActor("HammerMissile")); 
	if (mo)
	{
		mo->special1 = 0;
	}
	return 0;
}